

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::AddTargetStmt(ByteCodeGenerator *this,ParseNodeStmt *pnodeStmt)

{
  Type *ppFVar1;
  
  ppFVar1 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  FuncInfo::AddTargetStmt(*ppFVar1,pnodeStmt);
  return;
}

Assistant:

void ByteCodeGenerator::AddTargetStmt(ParseNodeStmt *pnodeStmt)
{
    FuncInfo *top = funcInfoStack->Top();
    top->AddTargetStmt(pnodeStmt);
}